

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

void LowererMD::ChangeToSub(Instr *instr,bool needFlags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IntConstOpnd *pIVar4;
  OpCode OVar5;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x4f3,"(instr)","instr");
    if (!bVar2) goto LAB_005d6750;
    *puVar3 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x4f4,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) goto LAB_005d6750;
    *puVar3 = 0;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x4f5,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar2) goto LAB_005d6750;
    *puVar3 = 0;
  }
  if (instr->m_src2 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x4f6,"(instr->GetSrc2())","instr->GetSrc2()");
    if (!bVar2) goto LAB_005d6750;
    *puVar3 = 0;
  }
  if (instr->m_dst->m_type == TyFloat64) {
    if (instr->m_src1->m_type != TyFloat64) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x4fa,"(instr->GetSrc1()->IsFloat64())","instr->GetSrc1()->IsFloat64()");
      if (!bVar2) goto LAB_005d6750;
      *puVar3 = 0;
    }
    if (instr->m_src2->m_type != TyFloat64) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x4fb,"(instr->GetSrc2()->IsFloat64())","instr->GetSrc2()->IsFloat64()");
      if (!bVar2) goto LAB_005d6750;
      *puVar3 = 0;
    }
    OVar5 = SUBSD;
    if (needFlags) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x4fc,"(!needFlags)","!needFlags");
      if (!bVar2) {
LAB_005d6750:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  else {
    bVar2 = IR::Opnd::IsEqual(instr->m_dst,instr->m_src1);
    OVar5 = SUB;
    if (bVar2) {
      bVar2 = IR::Opnd::IsIntConstOpnd(instr->m_src2);
      if (bVar2) {
        pIVar4 = IR::Opnd::AsIntConstOpnd(instr->m_src2);
        if ((pIVar4->super_EncodableOpnd<long>).m_value == 1) {
          IR::Instr::FreeSrc2(instr);
          OVar5 = DEC;
        }
      }
    }
  }
  instr->m_opcode = OVar5;
  return;
}

Assistant:

void LowererMD::ChangeToSub(IR::Instr *const instr, const bool needFlags)
{
    Assert(instr);
    Assert(instr->GetDst());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc2());

    if(instr->GetDst()->IsFloat64())
    {
        Assert(instr->GetSrc1()->IsFloat64());
        Assert(instr->GetSrc2()->IsFloat64());
        Assert(!needFlags);
        instr->m_opcode = Js::OpCode::SUBSD;
        return;
    }

    // Prefer DEC for sub by one
    if(instr->GetDst()->IsEqual(instr->GetSrc1()) &&
        instr->GetSrc2()->IsIntConstOpnd() &&
        instr->GetSrc2()->AsIntConstOpnd()->GetValue() == 1)
    {
        instr->FreeSrc2();
        instr->m_opcode = Js::OpCode::DEC;
        return;
    }

    instr->m_opcode = Js::OpCode::SUB;
}